

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_64bit_generated.h
# Opt level: O1

bool __thiscall RootTable::Verify(RootTable *this,Verifier *verifier)

{
  bool bVar1;
  ushort uVar2;
  RootTable *pRVar3;
  String *pSVar4;
  Vector<unsigned_char,_unsigned_long> *buf;
  Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int> *vec;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((bVar1) &&
     (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_long>(&this->super_Table,verifier,4), bVar1)
     ) {
    if (*(ushort *)(this + -(long)*(int *)this) < 5) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(ushort *)(this + (4 - (long)*(int *)this));
    }
    if (uVar2 == 0) {
      pRVar3 = (RootTable *)0x0;
    }
    else {
      pRVar3 = this + *(long *)(this + uVar2) + (ulong)uVar2;
    }
    if ((pRVar3 != (RootTable *)0x0) &&
       (bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                          (verifier,(uint8_t *)pRVar3,1,(size_t *)0x0), !bVar1)) {
      return false;
    }
    bVar1 = flatbuffers::Table::VerifyField<int>(&this->super_Table,verifier,6,4);
    if ((bVar1) &&
       (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_long>(&this->super_Table,verifier,8),
       bVar1)) {
      if (*(ushort *)(this + -(long)*(int *)this) < 9) {
        uVar2 = 0;
      }
      else {
        uVar2 = *(ushort *)(this + (8 - (long)*(int *)this));
      }
      if (uVar2 == 0) {
        pSVar4 = (String *)0x0;
      }
      else {
        pSVar4 = (String *)(this + *(long *)(this + uVar2) + (ulong)uVar2);
      }
      bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar4);
      if ((bVar1) &&
         (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_long>(&this->super_Table,verifier,10),
         bVar1)) {
        if (*(ushort *)(this + -(long)*(int *)this) < 0xb) {
          uVar2 = 0;
        }
        else {
          uVar2 = *(ushort *)(this + (10 - (long)*(int *)this));
        }
        if (uVar2 == 0) {
          pRVar3 = (RootTable *)0x0;
        }
        else {
          pRVar3 = this + *(long *)(this + uVar2) + (ulong)uVar2;
        }
        if ((pRVar3 != (RootTable *)0x0) &&
           (bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_long>
                              (verifier,(uint8_t *)pRVar3,1,(size_t *)0x0), !bVar1)) {
          return false;
        }
        bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,0xc);
        if (bVar1) {
          if (*(ushort *)(this + -(long)*(int *)this) < 0xd) {
            uVar2 = 0;
          }
          else {
            uVar2 = *(ushort *)(this + (0xc - (long)*(int *)this));
          }
          if (uVar2 == 0) {
            pSVar4 = (String *)0x0;
          }
          else {
            pSVar4 = (String *)(this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2);
          }
          bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,pSVar4);
          if ((bVar1) &&
             (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_long>
                                (&this->super_Table,verifier,0xe), bVar1)) {
            if (*(ushort *)(this + -(long)*(int *)this) < 0xf) {
              uVar2 = 0;
            }
            else {
              uVar2 = *(ushort *)(this + (0xe - (long)*(int *)this));
            }
            if (uVar2 == 0) {
              pRVar3 = (RootTable *)0x0;
            }
            else {
              pRVar3 = this + *(long *)(this + uVar2) + (ulong)uVar2;
            }
            if ((pRVar3 != (RootTable *)0x0) &&
               (bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_long>
                                  (verifier,(uint8_t *)pRVar3,1,(size_t *)0x0), !bVar1)) {
              return false;
            }
            if (*(ushort *)(this + -(long)*(int *)this) < 0xf) {
              uVar2 = 0;
            }
            else {
              uVar2 = *(ushort *)(this + (0xe - (long)*(int *)this));
            }
            if (uVar2 == 0) {
              buf = (Vector<unsigned_char,_unsigned_long> *)0x0;
            }
            else {
              buf = (Vector<unsigned_char,_unsigned_long> *)
                    (this + *(long *)(this + uVar2) + (ulong)uVar2);
            }
            bVar1 = flatbuffers::VerifierTemplate<false>::
                    VerifyNestedFlatBuffer<RootTable,_unsigned_long>(verifier,buf,(char *)0x0);
            if (!bVar1) {
              return false;
            }
            bVar1 = flatbuffers::Table::VerifyOffset<unsigned_long>
                              (&this->super_Table,verifier,0x10);
            if (bVar1) {
              if (*(ushort *)(this + -(long)*(int *)this) < 0x11) {
                uVar2 = 0;
              }
              else {
                uVar2 = *(ushort *)(this + (0x10 - (long)*(int *)this));
              }
              if (uVar2 == 0) {
                pRVar3 = (RootTable *)0x0;
              }
              else {
                pRVar3 = this + *(long *)(this + uVar2) + (ulong)uVar2;
              }
              if ((pRVar3 != (RootTable *)0x0) &&
                 (bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                                    (verifier,(uint8_t *)pRVar3,0x10,(size_t *)0x0), !bVar1)) {
                return false;
              }
              bVar1 = flatbuffers::Table::VerifyOffset<unsigned_long>
                                (&this->super_Table,verifier,0x12);
              if (bVar1) {
                if (*(ushort *)(this + -(long)*(int *)this) < 0x13) {
                  uVar2 = 0;
                }
                else {
                  uVar2 = *(ushort *)(this + (0x12 - (long)*(int *)this));
                }
                if (uVar2 == 0) {
                  pRVar3 = (RootTable *)0x0;
                }
                else {
                  pRVar3 = this + *(long *)(this + uVar2) + (ulong)uVar2;
                }
                if ((pRVar3 != (RootTable *)0x0) &&
                   (bVar1 = flatbuffers::VerifierTemplate<false>::
                            VerifyVectorOrString<unsigned_long>
                                      (verifier,(uint8_t *)pRVar3,0x10,(size_t *)0x0), !bVar1)) {
                  return false;
                }
                bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                  (&this->super_Table,verifier,0x14);
                if (bVar1) {
                  if (*(ushort *)(this + -(long)*(int *)this) < 0x15) {
                    uVar2 = 0;
                  }
                  else {
                    uVar2 = *(ushort *)(this + (0x14 - (long)*(int *)this));
                  }
                  if (uVar2 == 0) {
                    pRVar3 = (RootTable *)0x0;
                  }
                  else {
                    pRVar3 = this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2;
                  }
                  if ((pRVar3 != (RootTable *)0x0) &&
                     (bVar1 = flatbuffers::VerifierTemplate<false>::
                              VerifyVectorOrString<unsigned_int>
                                        (verifier,(uint8_t *)pRVar3,4,(size_t *)0x0), !bVar1)) {
                    return false;
                  }
                  if (*(ushort *)(this + -(long)*(int *)this) < 0x15) {
                    uVar2 = 0;
                  }
                  else {
                    uVar2 = *(ushort *)(this + (0x14 - (long)*(int *)this));
                  }
                  if (uVar2 == 0) {
                    vec = (Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int> *)0x0;
                  }
                  else {
                    vec = (Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int> *)
                          (this + (ulong)*(uint *)(this + uVar2) + (ulong)uVar2);
                  }
                  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfTables<WrapperTable>
                                    (verifier,vec);
                  if ((bVar1) &&
                     (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_long>
                                        (&this->super_Table,verifier,0x16), bVar1)) {
                    if (*(ushort *)(this + -(long)*(int *)this) < 0x17) {
                      uVar2 = 0;
                    }
                    else {
                      uVar2 = *(ushort *)(this + (0x16 - (long)*(int *)this));
                    }
                    if (uVar2 == 0) {
                      pRVar3 = (RootTable *)0x0;
                    }
                    else {
                      pRVar3 = this + *(long *)(this + uVar2) + (ulong)uVar2;
                    }
                    if ((pRVar3 != (RootTable *)0x0) &&
                       (bVar1 = flatbuffers::VerifierTemplate<false>::
                                VerifyVectorOrString<unsigned_long>
                                          (verifier,(uint8_t *)pRVar3,1,(size_t *)0x0), !bVar1)) {
                      return false;
                    }
                    verifier->depth_ = verifier->depth_ - 1;
                    return true;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyOffset64(verifier, VT_FAR_VECTOR) &&
           verifier.VerifyVector(far_vector()) &&
           VerifyField<int32_t>(verifier, VT_A, 4) &&
           VerifyOffset64(verifier, VT_FAR_STRING) &&
           verifier.VerifyString(far_string()) &&
           VerifyOffset64(verifier, VT_BIG_VECTOR) &&
           verifier.VerifyVector(big_vector()) &&
           VerifyOffset(verifier, VT_NEAR_STRING) &&
           verifier.VerifyString(near_string()) &&
           VerifyOffset64(verifier, VT_NESTED_ROOT) &&
           verifier.VerifyVector(nested_root()) &&
           verifier.VerifyNestedFlatBuffer<RootTable>(nested_root(), nullptr) &&
           VerifyOffset64(verifier, VT_FAR_STRUCT_VECTOR) &&
           verifier.VerifyVector(far_struct_vector()) &&
           VerifyOffset64(verifier, VT_BIG_STRUCT_VECTOR) &&
           verifier.VerifyVector(big_struct_vector()) &&
           VerifyOffset(verifier, VT_MANY_VECTORS) &&
           verifier.VerifyVector(many_vectors()) &&
           verifier.VerifyVectorOfTables(many_vectors()) &&
           VerifyOffset64(verifier, VT_FORCED_ALIGNED_VECTOR) &&
           verifier.VerifyVector(forced_aligned_vector()) &&
           verifier.EndTable();
  }